

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool trans_INSR_f(DisasContext_conflict1 *s,arg_rrr_esz *a)

{
  TCGContext_conflict1 *s_00;
  _Bool _Var1;
  undefined1 extraout_AL;
  TCGTemp *ts;
  
  s_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i64,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),
                        (long)(a->rm * 0x100 + 0xc10));
    do_insr_i64(s,a,(TCGv_i64)((long)ts - (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,ts);
    return (_Bool)extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool trans_INSR_f(DisasContext *s, arg_rrr_esz *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_ld_i64(tcg_ctx, t, tcg_ctx->cpu_env, vec_reg_offset(s, a->rm, 0, MO_64));
        do_insr_i64(s, a, t);
        tcg_temp_free_i64(tcg_ctx, t);
    }
    return true;
}